

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.h
# Opt level: O3

Clause * Reason_new(int sz)

{
  Clause *c;
  Clause *local_18;
  
  local_18 = (Clause *)malloc((ulong)(uint)sz * 4 + 8);
  *(uint *)local_18 = sz << 8 | 2;
  vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_18);
  return local_18;
}

Assistant:

static inline Clause* Reason_new(int sz) {
	auto* c = (Clause*)malloc(sizeof(Clause) + sz * sizeof(Lit));
	c->clearFlags();
	c->temp_expl = 1;
	c->sz = sz;
	sat.rtrail.last().push(c);
	return c;
}